

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_tools.cpp
# Opt level: O0

QString * qulltoa(qulonglong number,int base,QStringView zero)

{
  undefined1 auVar1 [16];
  bool bVar2;
  short sVar3;
  char16_t cVar4;
  char16_t cVar5;
  uint uVar6;
  char32_t zero_00;
  char32_t ucs4;
  QStringView *this;
  qsizetype qVar7;
  char16_t *pcVar8;
  int in_EDX;
  ulong in_RSI;
  long *plVar9;
  QString *in_RDI;
  long in_FS_OFFSET;
  char32_t digit;
  char32_t zeroUcs4;
  char16_t zeroUcs2;
  char16_t *end;
  uint maxlen;
  int r_1;
  int r;
  size_t RuntimeThreshold;
  size_t i;
  char16_t *p;
  char16_t buff [128];
  uint6 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0e;
  byte in_stack_fffffffffffffe0f;
  QStringView *in_stack_fffffffffffffe10;
  QString *in_stack_fffffffffffffe18;
  bool local_1c1;
  ulong local_1a0;
  ulong local_178;
  ulong local_150;
  QChar local_134;
  char16_t local_132;
  QString local_130;
  QStringView local_118 [17];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_130.d.size = (qsizetype)&local_8;
  local_1c1 = true;
  if (in_EDX == 10) {
    in_stack_fffffffffffffe18 = &local_130;
    this = (QStringView *)std::data<char16_t_const,2ul>((char16_t (*) [2])0x1a3ec6);
    for (local_150 = 0; (local_150 < 2 && (L"0.0"[local_150 + 2] != L'\0'));
        local_150 = local_150 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (this,(char16_t *)in_stack_fffffffffffffe18,(qsizetype)in_stack_fffffffffffffe10);
    local_1c1 = operator==(in_stack_fffffffffffffe10,
                           (QStringView *)
                           CONCAT17(in_stack_fffffffffffffe0f,
                                    CONCAT16(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe08)));
  }
  if (local_1c1 == false) {
    qVar7 = QStringView::size(local_118);
    in_stack_fffffffffffffe0f = 0;
    if (qVar7 != 0) {
      local_132 = (char16_t)
                  QStringView::at((QStringView *)
                                  (ulong)CONCAT16(in_stack_fffffffffffffe0e,
                                                  in_stack_fffffffffffffe08),0x14d4fa);
      bVar2 = QChar::isSurrogate((QChar *)0x14d50f);
      in_stack_fffffffffffffe0f = bVar2 ^ 0xff;
    }
    local_1a0 = in_RSI;
    if ((in_stack_fffffffffffffe0f & 1) == 0) {
      qVar7 = QStringView::size(local_118);
      in_stack_fffffffffffffe0e = false;
      if (qVar7 == 2) {
        QStringView::at((QStringView *)
                        CONCAT17(in_stack_fffffffffffffe0f,(uint7)in_stack_fffffffffffffe08),
                        0x14d5d9);
        in_stack_fffffffffffffe0e = QChar::isHighSurrogate((QChar *)0x14d5ee);
      }
      if ((bool)in_stack_fffffffffffffe0e != false) {
        QStringView::at((QStringView *)
                        CONCAT17(in_stack_fffffffffffffe0f,
                                 CONCAT16(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe08)),
                        0x14d610);
        QStringView::at((QStringView *)
                        CONCAT17(in_stack_fffffffffffffe0f,
                                 CONCAT16(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe08)),
                        0x14d627);
        zero_00 = QChar::surrogateToUcs4((QChar)0x0,(QChar)0x0);
        for (; local_1a0 != 0; local_1a0 = local_1a0 / (ulong)(long)in_EDX) {
          ucs4 = unicodeForDigit<char32_t>((uint)(local_1a0 % (ulong)(long)in_EDX),zero_00);
          cVar5 = QChar::lowSurrogate(ucs4);
          *(char16_t *)(local_130.d.size + -2) = cVar5;
          local_130.d.size = local_130.d.size + -2;
          cVar5 = QChar::highSurrogate(ucs4);
          *(char16_t *)(local_130.d.size + -2) = cVar5;
          local_130.d.size = (qsizetype)(local_130.d.size + -2);
        }
      }
    }
    else {
      local_134 = QStringView::at((QStringView *)
                                  CONCAT17(in_stack_fffffffffffffe0f,
                                           CONCAT16(in_stack_fffffffffffffe0e,
                                                    in_stack_fffffffffffffe08)),0x14d533);
      pcVar8 = QChar::unicode(&local_134);
      cVar5 = *pcVar8;
      for (; local_1a0 != 0; local_1a0 = local_1a0 / (ulong)(long)in_EDX) {
        cVar4 = unicodeForDigit<char16_t>((uint)(local_1a0 % (ulong)(long)in_EDX),cVar5);
        *(char16_t *)(local_130.d.size + -2) = cVar4;
        local_130.d.size = (qsizetype)(local_130.d.size + -2);
      }
    }
  }
  else {
    in_stack_fffffffffffffe10 = (QStringView *)(ulong)(in_EDX - 2);
    local_178 = in_RSI;
    switch(in_stack_fffffffffffffe10) {
    case (QStringView *)0x0:
      do {
        plVar9 = (long *)(local_130.d.size + -2);
        *(ushort *)(local_130.d.size + -2) = ((ushort)local_178 & 1) + 0x30;
        local_178 = local_178 >> 1;
        local_130.d.size = (qsizetype)plVar9;
      } while (local_178 != 0);
      break;
    default:
      do {
        sVar3 = 0x57;
        if ((int)(local_178 % (ulong)(long)in_EDX) < 10) {
          sVar3 = 0x30;
        }
        plVar9 = (long *)(local_130.d.size + -2);
        *(short *)(local_130.d.size + -2) = sVar3 + (short)(local_178 % (ulong)(long)in_EDX);
        local_178 = local_178 / (ulong)(long)in_EDX;
        local_130.d.size = (qsizetype)plVar9;
      } while (local_178 != 0);
      break;
    case (QStringView *)0x6:
      do {
        plVar9 = (long *)(local_130.d.size + -2);
        *(ushort *)(local_130.d.size + -2) = ((ushort)local_178 & 7) + 0x30;
        local_178 = local_178 >> 3;
        local_130.d.size = (qsizetype)plVar9;
      } while (local_178 != 0);
      break;
    case (QStringView *)0x8:
      do {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_178;
        plVar9 = (long *)(local_130.d.size + -2);
        *(short *)(local_130.d.size + -2) = SUB162(auVar1 % ZEXT816(10),0) + 0x30;
        local_178 = local_178 / 10;
        local_130.d.size = (qsizetype)plVar9;
      } while (local_178 != 0);
      break;
    case (QStringView *)0xe:
      do {
        uVar6 = (uint)local_178 & 0xf;
        sVar3 = 0x57;
        if (uVar6 < 10) {
          sVar3 = 0x30;
        }
        plVar9 = (long *)(local_130.d.size + -2);
        *(short *)(local_130.d.size + -2) = sVar3 + (short)uVar6;
        local_178 = local_178 >> 4;
        local_130.d.size = (qsizetype)plVar9;
      } while (local_178 != 0);
    }
  }
  QString::QString(in_stack_fffffffffffffe18,(QChar *)in_stack_fffffffffffffe10,
                   CONCAT17(in_stack_fffffffffffffe0f,
                            CONCAT16(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe08)));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString qulltoa(qulonglong number, int base, const QStringView zero)
{
    // Length of MAX_ULLONG in base 2 is 64; and we may need a surrogate pair
    // per digit. We do not need a terminator.
    const unsigned maxlen = 128;
    static_assert(CHAR_BIT * sizeof(number) <= maxlen);
    Q_DECL_UNINITIALIZED char16_t buff[maxlen];
    char16_t *const end = buff + maxlen, *p = end;

    if (base != 10 || zero == u"0") {
        qulltoString_helper<char16_t>(number, base, p);
    } else if (zero.size() && !zero.at(0).isSurrogate()) {
        const char16_t zeroUcs2 = zero.at(0).unicode();
        while (number != 0) {
            *(--p) = unicodeForDigit(number % base, zeroUcs2);

            number /= base;
        }
    } else if (zero.size() == 2 && zero.at(0).isHighSurrogate()) {
        const char32_t zeroUcs4 = QChar::surrogateToUcs4(zero.at(0), zero.at(1));
        while (number != 0) {
            const char32_t digit = unicodeForDigit(number % base, zeroUcs4);

            *(--p) = QChar::lowSurrogate(digit);
            *(--p) = QChar::highSurrogate(digit);

            number /= base;
        }
    } else { // zero should always be either a non-surrogate or a surrogate pair:
        Q_UNREACHABLE_RETURN(QString());
    }

    return QString(reinterpret_cast<QChar *>(p), end - p);
}